

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * getVersion(char *aExecutable)

{
  FILE *__stream;
  char *__s;
  size_t sVar1;
  char *lTmp;
  FILE *lIn;
  char lTestedString [1024];
  char *aExecutable_local;
  
  strcpy((char *)&lIn,aExecutable);
  strcat((char *)&lIn," --version");
  __stream = popen((char *)&lIn,"r");
  __s = fgets(getVersion::lBuff,0x400,__stream);
  pclose(__stream);
  sVar1 = strcspn(__s,"0123456789");
  return __s + sVar1;
}

Assistant:

static char const * getVersion( char const * const aExecutable ) /*version must be first numeral*/
{
	static char lBuff [MAX_PATH_OR_CMD] ;
	char lTestedString [MAX_PATH_OR_CMD] ;
	FILE * lIn ;
	char * lTmp ;
		
    strcpy( lTestedString , aExecutable ) ;
    strcat( lTestedString , " --version" ) ;

    lIn = popen( lTestedString , "r" ) ;
        lTmp = fgets( lBuff , sizeof( lBuff ) , lIn ) ;
        pclose( lIn ) ;
	
	lTmp += strcspn(lTmp,"0123456789");
	/* printf("lTmp:%s\n", lTmp); */
	return lTmp ;
}